

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall
Win32MakefileGenerator::writeStandardParts(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  long lVar2;
  QString file;
  char cVar3;
  bool bVar4;
  int iVar5;
  QTextStream *pQVar6;
  QTextStream *pQVar7;
  QTextStream *pQVar8;
  ProStringList *pPVar9;
  undefined4 extraout_var;
  QList<ProString> *this_00;
  ProString *pPVar10;
  ProStringList *pPVar11;
  ProStringList *paths;
  ProString *pPVar12;
  ProString *variableName;
  long in_FS_OFFSET;
  ProStringList *in_stack_fffffffffffffdf0;
  qsizetype in_stack_fffffffffffffdf8;
  QArrayDataPointer<char16_t> local_200;
  QArrayDataPointer<char16_t> local_1e8 [2];
  ProString local_1b8;
  QArrayDataPointer<QString> local_188 [2];
  QStringBuilder<ProString,_ProString> local_158;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<QString> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  ProString local_a8;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::writeExportedVariables(&this->super_MakefileGenerator,t);
  QTextStream::operator<<(t,"####### Compiler, tools and options\n\n");
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"CC            = ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_CC");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_158);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_a8);
  Qt::endl(pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar6 = t;
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"CXX           = ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_CXX");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_158);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_a8);
  Qt::endl(pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"DEFINES       = ");
  ProKey::ProKey((ProKey *)&local_158,"PRL_EXPORT_DEFINES");
  QString::QString(&local_1b8.m_string,"-D");
  QString::QString((QString *)local_1e8," -D");
  QString::QString((QString *)&local_58," ");
  MakefileGenerator::varGlue
            ((QString *)local_188,&this->super_MakefileGenerator,(ProKey *)&local_158,
             &local_1b8.m_string,(QString *)local_1e8,(QString *)&local_58);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_188);
  ProKey::ProKey((ProKey *)&local_a8,"DEFINES");
  QString::QString((QString *)&local_c8,"-D");
  QString::QString((QString *)&local_e0," -D");
  QString::QString((QString *)&local_f8,"");
  MakefileGenerator::varGlue
            ((QString *)&local_78,&this->super_MakefileGenerator,(ProKey *)&local_a8,
             (QString *)&local_c8,(QString *)&local_e0,(QString *)&local_f8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_78);
  Qt::endl(pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar7 = pQVar6;
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar6,"CFLAGS        = ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_CFLAGS");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  QTextStream::operator<<(pQVar8," $(DEFINES)\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar6,"CXXFLAGS      = ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_CXXFLAGS");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  QTextStream::operator<<(pQVar8," $(DEFINES)\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x23])
            (this,pQVar6);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x24])
            (this,pQVar6);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[6])
            (this,pQVar6);
  Qt::endl(pQVar6);
  QTextStream::operator<<(pQVar6,"####### Output directory\n\n");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"OBJECTS_DIR");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
  lVar2 = (pPVar9->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  if (lVar2 == 0) {
    QTextStream::operator<<(pQVar6,"OBJECTS_DIR   = . \n");
  }
  else {
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"OBJECTS_DIR   = ");
    ProKey::ProKey((ProKey *)&local_158,"OBJECTS_DIR");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (local_188,this,&local_158);
    QString::QString(&local_1b8.m_string,"\\\\$");
    QRegularExpression::QRegularExpression((QRegularExpression *)local_1e8,&local_1b8,0);
    iVar5 = QString::remove((QString *)local_188,(char *)local_1e8);
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_a8,this,CONCAT44(extraout_var,iVar5));
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_a8);
    Qt::endl(pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    pQVar6 = pQVar7;
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_1e8);
    pQVar7 = pQVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  }
  Qt::endl(pQVar6);
  QTextStream::operator<<(pQVar6,"####### Files\n\n");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"SOURCES       = ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"SOURCES");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
  MakefileGenerator::escapeFilePaths
            ((ProStringList *)&local_1b8,&this->super_MakefileGenerator,pPVar9);
  MakefileGenerator::valList
            ((QString *)local_188,&this->super_MakefileGenerator,(ProStringList *)&local_1b8);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_188);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_a8,"GENERATED_SOURCES");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
  MakefileGenerator::escapeFilePaths
            ((ProStringList *)&local_58,&this->super_MakefileGenerator,pPVar9);
  MakefileGenerator::valList
            ((QString *)local_1e8,&this->super_MakefileGenerator,(ProStringList *)&local_58);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_1e8);
  Qt::endl(pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1e8);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)&local_158,"DESTDIR");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_58,this,&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  local_78.size = -0x5555555555555556;
  local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Option::fixPathToTargetOS((QString *)&local_78,(QString *)&local_58,false,true);
  if (local_78.size != 0) {
    cVar3 = QString::endsWith((QChar)(char16_t)&local_58,0x2f);
    if (cVar3 == '\0') {
      cVar3 = QString::endsWith((QString *)&local_58,0x26bbd0);
      if (cVar3 == '\0') goto LAB_001dd211;
    }
    QString::append((QString *)&local_78);
  }
LAB_001dd211:
  local_c8.size = -0x5555555555555556;
  local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_188,"TARGET");
  QMakeEvaluator::first(&local_a8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_188);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_1e8,"TARGET_EXT");
  QMakeEvaluator::first(&local_1b8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1e8);
  QStringBuilder<ProString,_ProString>::QStringBuilder(&local_158,&local_a8,&local_1b8);
  QStringBuilder<ProString,_ProString>::convertTo<QString>((QString *)&local_c8,&local_158);
  QStringBuilder<ProString,_ProString>::~QStringBuilder(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"DEST_TARGET");
  this_00 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158)->
             super_QList<ProString>;
  local_188[0].d = (Data *)&local_78;
  local_188[0].ptr = (QString *)&local_c8;
  ProString::ProString<QString&,QString&>
            (&local_a8,(QStringBuilder<QString_&,_QString_&> *)local_188);
  QList<ProString>::emplaceFront<ProString>(this_00,&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar6 = pQVar7;
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x25])
            (this,pQVar7);
  MakefileGenerator::writeExtraCompilerVariables(&this->super_MakefileGenerator,pQVar7);
  MakefileGenerator::writeExtraVariables(&this->super_MakefileGenerator,pQVar7);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar7,"DIST          = ");
  ProKey::ProKey((ProKey *)&local_158,"DISTFILES");
  MakefileGenerator::fileVarList
            (&local_1b8.m_string,&this->super_MakefileGenerator,(ProKey *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_1b8);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,' ');
  ProKey::ProKey((ProKey *)&local_a8,"HEADERS");
  MakefileGenerator::fileVarList
            ((QString *)local_1e8,&this->super_MakefileGenerator,(ProKey *)&local_a8);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)local_1e8);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,' ');
  ProKey::ProKey((ProKey *)local_188,"SOURCES");
  MakefileGenerator::fileVarList
            ((QString *)&local_e0,&this->super_MakefileGenerator,(ProKey *)local_188);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_e0);
  Qt::endl(pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar7,"QMAKE_TARGET  = ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_ORIG_TARGET");
  MakefileGenerator::fileVar(&local_a8.m_string,&this->super_MakefileGenerator,(ProKey *)&local_158)
  ;
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  Qt::endl(pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar7,"DESTDIR        = ");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (&local_158,this,&local_78);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_158);
  QTextStream::operator<<(pQVar8," #avoid trailing-slash linebreak\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar7,"TARGET         = ");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (&local_158,this,&local_c8);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_158);
  Qt::endl(pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar7,"DESTDIR_TARGET = ");
  ProKey::ProKey((ProKey *)&local_158,"DEST_TARGET");
  MakefileGenerator::fileVar(&local_a8.m_string,&this->super_MakefileGenerator,(ProKey *)&local_158)
  ;
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  Qt::endl(pQVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  Qt::endl(pQVar7);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x26])
            (this,pQVar7);
  QTextStream::operator<<(pQVar7,"####### Build rules\n\n");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x27])
            (this,pQVar7);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_a8,"TEMPLATE");
  QMakeEvaluator::first(&local_158.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
  bVar4 = ProString::operator!=(&local_158.a,"aux");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  if (bVar4) {
    pQVar1 = (this->super_MakefileGenerator).project;
    QString::QString(&local_a8.m_string,"shared");
    bVar4 = QMakeProject::isActiveConfig(pQVar1,&local_a8.m_string,false);
    if (bVar4) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_158,"DLLDESTDIR");
      pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
      lVar2 = (pPVar9->super_QList<ProString>).d.size;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      pQVar7 = pQVar6;
      if (lVar2 != 0) {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_158,"DLLDESTDIR");
        pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
        pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
        in_stack_fffffffffffffdf0 = pPVar9;
        for (pPVar12 = pPVar10; pQVar7 = pQVar6,
            pPVar12 != pPVar10 + (pPVar9->super_QList<ProString>).d.size; pPVar12 = pPVar12 + 1) {
          pQVar7 = (QTextStream *)
                   QTextStream::operator<<(pQVar6,"\t-$(COPY_FILE) $(DESTDIR_TARGET) ");
          ProString::toQString((QString *)local_188,pPVar12);
          Option::fixPathToTargetOS(&local_a8.m_string,(QString *)local_188,false,true);
          pPVar9 = in_stack_fffffffffffffdf0;
          (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc]
          )(&local_158,this,&local_a8);
          in_stack_fffffffffffffdf0 = pPVar9;
          pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_158);
          Qt::endl(pQVar7);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_188);
          pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
        }
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      pQVar7 = pQVar6;
    }
    pQVar6 = pQVar7;
    Qt::endl(pQVar7);
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x28])
              (this,pQVar7);
  }
  MakefileGenerator::writeMakeQmake(&this->super_MakefileGenerator,pQVar7,false);
  local_188[0].size = -0x5555555555555556;
  local_188[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_188[0].ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  MakefileGenerator::fileFixify
            ((QStringList *)local_188,&this->super_MakefileGenerator,&Option::mkfile::project_files,
             (FileFixifyTypes)0x0,true);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_INTERNAL_INCLUDED_FILES");
  bVar4 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  if (!bVar4) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_158,"QMAKE_INTERNAL_INCLUDED_FILES");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
    ProStringList::toQStringList((QStringList *)&local_a8,pPVar9);
    QList<QString>::append((QList<QString> *)local_188,(QList<QString> *)&local_a8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"TRANSLATIONS");
  bVar4 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  if (!bVar4) {
    ProKey::ProKey((ProKey *)&local_158,"TRANSLATIONS");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_a8,this,&local_158);
    QList<QString>::emplaceBack<QString>((QList<QString> *)local_188,&local_a8.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"FORMS");
  bVar4 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  if (!bVar4) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_158,"FORMS");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
    for (pPVar12 = pPVar10; pPVar12 != pPVar10 + (pPVar9->super_QList<ProString>).d.size;
        pPVar12 = pPVar12 + 1) {
      local_158.a.m_string.d.size = -0x5555555555555556;
      local_158.a.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.a.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_1b8.m_string.d.ptr = (char16_t *)QList<QString>::begin(&Option::h_ext);
      local_1b8.m_string.d.d = (Data *)pPVar12;
      QStringBuilder<const_ProString_&,_QString_&>::convertTo<QString>
                (&local_a8.m_string,(QStringBuilder<const_ProString_&,_QString_&> *)&local_1b8);
      MakefileGenerator::fileFixify
                ((QString *)&local_158,&this->super_MakefileGenerator,&local_a8.m_string,
                 (FileFixifyTypes)0x0,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      local_200.d = local_158.a.m_string.d.d;
      local_200.ptr = local_158.a.m_string.d.ptr;
      local_200.size = local_158.a.m_string.d.size;
      if (local_158.a.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_158.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      file.d.ptr = (char16_t *)in_stack_fffffffffffffdf0;
      file.d.d = (Data *)pQVar6;
      file.d.size = in_stack_fffffffffffffdf8;
      bVar4 = MakefileGenerator::exists(&this->super_MakefileGenerator,file);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
      if (bVar4) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)local_188,(QString *)&local_158);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
      pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
    }
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar6,"dist:\n\t");
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"$(ZIP) ");
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_ORIG_TARGET");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_1b8,this,&local_158);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_1b8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,".zip $(SOURCES) $(DIST) ");
  MakefileGenerator::escapeFilePaths
            ((QStringList *)&local_e0,&this->super_MakefileGenerator,(QStringList *)local_188);
  QListSpecialMethods<QString>::join
            ((QString *)local_1e8,(QListSpecialMethods<QString> *)&local_e0,(QChar)0x20);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_1e8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
  ProKey::ProKey((ProKey *)&local_a8,"TRANSLATIONS");
  MakefileGenerator::fileVar
            ((QString *)&local_f8,&this->super_MakefileGenerator,(ProKey *)&local_a8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_f8);
  QTextStream::operator<<(pQVar7,' ');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_158,"QMAKE_EXTRA_COMPILERS");
  bVar4 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  if (!bVar4) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_158,"QMAKE_EXTRA_COMPILERS");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
    for (pPVar12 = pPVar10; pPVar12 != pPVar10 + (pPVar9->super_QList<ProString>).d.size;
        pPVar12 = pPVar12 + 1) {
      pQVar1 = (this->super_MakefileGenerator).project;
      local_a8.m_string.d.ptr = L".input";
      local_a8.m_string.d.d = (Data *)pPVar12;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                (&local_158.a,(QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_a8);
      pPVar11 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
      pPVar10 = (pPVar11->super_QList<ProString>).d.ptr;
      for (variableName = pPVar10;
          variableName != pPVar10 + (pPVar11->super_QList<ProString>).d.size;
          variableName = variableName + 1) {
        paths = QMakeEvaluator::valuesRef
                          (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,
                           (ProKey *)variableName);
        MakefileGenerator::escapeFilePaths
                  ((ProStringList *)&local_a8,&this->super_MakefileGenerator,paths);
        ProStringList::join((QString *)&local_158,(ProStringList *)&local_a8,(QChar)0x20);
        pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_158);
        QTextStream::operator<<(pQVar7,' ');
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_a8);
        pPVar10 = (pPVar11->super_QList<ProString>).d.ptr;
      }
      pPVar10 = (pPVar9->super_QList<ProString>).d.ptr;
    }
  }
  pQVar7 = (QTextStream *)Qt::endl(pQVar6);
  Qt::endl(pQVar7);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x21])
            (this,pQVar6);
  MakefileGenerator::writeExtraTargets(&this->super_MakefileGenerator,pQVar6);
  MakefileGenerator::writeExtraCompilerTargets(&this->super_MakefileGenerator,pQVar6);
  pQVar6 = (QTextStream *)Qt::endl(pQVar6);
  Qt::endl(pQVar6);
  QArrayDataPointer<QString>::~QArrayDataPointer(local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeStandardParts(QTextStream &t)
{
    writeExportedVariables(t);

    t << "####### Compiler, tools and options\n\n";
    t << "CC            = " << var("QMAKE_CC") << Qt::endl;
    t << "CXX           = " << var("QMAKE_CXX") << Qt::endl;
    t << "DEFINES       = "
      << varGlue("PRL_EXPORT_DEFINES","-D"," -D"," ")
      << varGlue("DEFINES","-D"," -D","") << Qt::endl;
    t << "CFLAGS        = " << var("QMAKE_CFLAGS") << " $(DEFINES)\n";
    t << "CXXFLAGS      = " << var("QMAKE_CXXFLAGS") << " $(DEFINES)\n";

    writeIncPart(t);
    writeLibsPart(t);
    writeDefaultVariables(t);
    t << Qt::endl;

    t << "####### Output directory\n\n";
    if(!project->values("OBJECTS_DIR").isEmpty())
        t << "OBJECTS_DIR   = " << escapeFilePath(var("OBJECTS_DIR").remove(QRegularExpression("\\\\$"))) << Qt::endl;
    else
        t << "OBJECTS_DIR   = . \n";
    t << Qt::endl;

    t << "####### Files\n\n";
    t << "SOURCES       = " << valList(escapeFilePaths(project->values("SOURCES")))
      << " " << valList(escapeFilePaths(project->values("GENERATED_SOURCES"))) << Qt::endl;

    // do this here so we can set DEST_TARGET to be the complete path to the final target if it is needed.
    QString orgDestDir = var("DESTDIR");
    QString destDir = Option::fixPathToTargetOS(orgDestDir, false);
    if (!destDir.isEmpty() && (orgDestDir.endsWith('/') || orgDestDir.endsWith(Option::dir_sep)))
        destDir += Option::dir_sep;
    QString target = QString(project->first("TARGET")+project->first("TARGET_EXT"));
    project->values("DEST_TARGET").prepend(destDir + target);

    writeObjectsPart(t);

    writeExtraCompilerVariables(t);
    writeExtraVariables(t);

    t << "DIST          = " << fileVarList("DISTFILES") << ' '
      << fileVarList("HEADERS") << ' ' << fileVarList("SOURCES") << Qt::endl;
    t << "QMAKE_TARGET  = " << fileVar("QMAKE_ORIG_TARGET") << Qt::endl;  // unused
    // The comment is important to maintain variable compatibility with Unix
    // Makefiles, while not interpreting a trailing-slash as a linebreak
    t << "DESTDIR        = " << escapeFilePath(destDir) << " #avoid trailing-slash linebreak\n";
    t << "TARGET         = " << escapeFilePath(target) << Qt::endl;
    t << "DESTDIR_TARGET = " << fileVar("DEST_TARGET") << Qt::endl;
    t << Qt::endl;

    writeImplicitRulesPart(t);

    t << "####### Build rules\n\n";
    writeBuildRulesPart(t);

    if (project->first("TEMPLATE") != "aux") {
        if (project->isActiveConfig("shared") && !project->values("DLLDESTDIR").isEmpty()) {
            const ProStringList &dlldirs = project->values("DLLDESTDIR");
            for (ProStringList::ConstIterator dlldir = dlldirs.begin(); dlldir != dlldirs.end(); ++dlldir) {
                t << "\t-$(COPY_FILE) $(DESTDIR_TARGET) "
                  << escapeFilePath(Option::fixPathToTargetOS((*dlldir).toQString(), false)) << Qt::endl;
            }
        }
        t << Qt::endl;

        writeRcFilePart(t);
    }

    writeMakeQmake(t);

    QStringList dist_files = fileFixify(Option::mkfile::project_files);
    if(!project->isEmpty("QMAKE_INTERNAL_INCLUDED_FILES"))
        dist_files += project->values("QMAKE_INTERNAL_INCLUDED_FILES").toQStringList();
    if(!project->isEmpty("TRANSLATIONS"))
        dist_files << var("TRANSLATIONS");
    if(!project->isEmpty("FORMS")) {
        const ProStringList &forms = project->values("FORMS");
        for (ProStringList::ConstIterator formit = forms.begin(); formit != forms.end(); ++formit) {
            QString ui_h = fileFixify((*formit) + Option::h_ext.first());
            if(exists(ui_h))
                dist_files << ui_h;
        }
    }
    t << "dist:\n\t"
      << "$(ZIP) " << var("QMAKE_ORIG_TARGET") << ".zip $(SOURCES) $(DIST) "
      << escapeFilePaths(dist_files).join(' ') << ' ' << fileVar("TRANSLATIONS") << ' ';
    if(!project->isEmpty("QMAKE_EXTRA_COMPILERS")) {
        const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
        for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
            const ProStringList &inputs = project->values(ProKey(*it + ".input"));
            for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                const ProStringList &val = project->values((*input).toKey());
                t << escapeFilePaths(val).join(' ') << ' ';
            }
        }
    }
    t << Qt::endl << Qt::endl;

    writeCleanParts(t);
    writeExtraTargets(t);
    writeExtraCompilerTargets(t);
    t << Qt::endl << Qt::endl;
}